

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LUX_Run03.hh
# Opt level: O2

double __thiscall
DetectorExample_LUX_RUN03::FitS1
          (DetectorExample_LUX_RUN03 *this,double xPos_mm,double yPos_mm,double zPos_mm,LCE map)

{
  ostream *poVar1;
  double __x;
  double dVar2;
  
  __x = SQRT(yPos_mm * yPos_mm + xPos_mm * xPos_mm);
  dVar2 = pow(__x,3.0);
  dVar2 = (dVar2 * SQRT(ABS(zPos_mm + -318.84)) * -1.1525e-07 +
          zPos_mm * zPos_mm * 0.0002257 + zPos_mm * -0.3071 + 307.9) / 307.9;
  if ((((dVar2 < 0.5) || (1.5 < dVar2)) || (NAN(dVar2))) && (__x < (this->super_VDetector).radmax))
  {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "ERR: S1 corrections exceed a 50% difference. Are you sure you didn\'t forget to change LUX numbers for your own detector??"
                            );
    std::endl<char,std::char_traits<char>>(poVar1);
    dVar2 = 1.0;
  }
  return dVar2;
}

Assistant:

double FitS1(double xPos_mm, double yPos_mm, double zPos_mm,
               LCE map) override {
    double radius = sqrt(pow(xPos_mm, 2.) + pow(yPos_mm, 2.));
    double amplitude = 307.9 - 0.3071 * zPos_mm + 0.0002257 * pow(zPos_mm, 2.);
    double shape = 1.1525e-7 * sqrt(std::abs(zPos_mm - 318.84));
    double finalCorr = -shape * pow(radius, 3.) + amplitude;
    finalCorr /= 307.9;
    if ((finalCorr < 0.5 || finalCorr > 1.5 || std::isnan(finalCorr)) &&
        radius < radmax) {
      cerr << "ERR: S1 corrections exceed a 50% difference. Are you sure you "
              "didn't forget to change LUX numbers for your own detector??"
           << endl;
      return 1.;
    } else
      return finalCorr;
  }